

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall SQVM::StringCat(SQVM *this,SQObjectPtr *str,SQObjectPtr *obj,SQObjectPtr *dest)

{
  size_t __n;
  size_t __n_00;
  SQSharedState *this_00;
  bool bVar1;
  SQChar *pSVar2;
  SQString *x;
  SQChar *s;
  SQInteger ol;
  SQInteger l;
  undefined1 local_50 [8];
  SQObjectPtr b;
  SQObjectPtr a;
  SQObjectPtr *dest_local;
  SQObjectPtr *obj_local;
  SQObjectPtr *str_local;
  SQVM *this_local;
  
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&b.super_SQObject._unVal);
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_50);
  bVar1 = ToString(this,str,(SQObjectPtr *)&b.super_SQObject._unVal);
  if (bVar1) {
    bVar1 = ToString(this,obj,(SQObjectPtr *)local_50);
    if (bVar1) {
      __n = *(size_t *)(a.super_SQObject._0_8_ + 0x28);
      __n_00 = *(size_t *)(b.super_SQObject._0_8_ + 0x28);
      pSVar2 = SQSharedState::GetScratchPad(this->_sharedstate,__n + 1 + __n_00);
      memcpy(pSVar2,(void *)(a.super_SQObject._0_8_ + 0x38),__n);
      memcpy(pSVar2 + __n,(void *)(b.super_SQObject._0_8_ + 0x38),__n_00);
      this_00 = this->_sharedstate;
      pSVar2 = SQSharedState::GetScratchPad(this_00,-1);
      x = SQString::Create(this_00,pSVar2,__n + __n_00);
      ::SQObjectPtr::operator=(dest,x);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_50);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&b.super_SQObject._unVal);
  return this_local._7_1_;
}

Assistant:

bool SQVM::StringCat(const SQObjectPtr &str,const SQObjectPtr &obj,SQObjectPtr &dest)
{
    SQObjectPtr a, b;
    if(!ToString(str, a)) return false;
    if(!ToString(obj, b)) return false;
    SQInteger l = _string(a)->_len , ol = _string(b)->_len;
    SQChar *s = _sp(sq_rsl(l + ol + 1));
    memcpy(s, _stringval(a), sq_rsl(l));
    memcpy(s + l, _stringval(b), sq_rsl(ol));
    dest = SQString::Create(_ss(this), _spval, l + ol);
    return true;
}